

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

ArrayObject *
CreateTypedArray<unsigned_short,false>(ScriptContext *scriptContext,void *data,uint length)

{
  byte *buffer;
  uint32 length_00;
  Recycler *pRVar1;
  ArrayBufferBase *arrayBuffer_00;
  DynamicType *type;
  ArrayObject *pAVar2;
  TrackAllocData local_58;
  ArrayBufferBase *local_30;
  ArrayBufferBase *arrayBuffer;
  JavascriptLibrary *library;
  byte *pbStack_18;
  uint length_local;
  void *data_local;
  ScriptContext *scriptContext_local;
  
  library._4_4_ = length;
  pbStack_18 = (byte *)data;
  data_local = scriptContext;
  arrayBuffer = (ArrayBufferBase *)Js::ScriptContext::GetLibrary(scriptContext);
  pRVar1 = Js::ScriptContext::GetRecycler((ScriptContext *)data_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&Js::ExternalArrayBuffer::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
             ,0x9bd);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  arrayBuffer_00 = (ArrayBufferBase *)new<Memory::Recycler>(0x48,pRVar1,0x43c4b0);
  buffer = pbStack_18;
  length_00 = library._4_4_ << 1;
  type = Js::JavascriptLibrary::GetArrayBufferType((JavascriptLibrary *)arrayBuffer);
  Js::ExternalArrayBuffer::ExternalArrayBuffer
            ((ExternalArrayBuffer *)arrayBuffer_00,buffer,length_00,type);
  local_30 = arrayBuffer_00;
  pAVar2 = (ArrayObject *)
           Js::TypedArray<unsigned_short,_false,_false>::Create
                     (arrayBuffer_00,0,library._4_4_,(JavascriptLibrary *)arrayBuffer);
  return pAVar2;
}

Assistant:

Js::ArrayObject* CreateTypedArray(Js::ScriptContext *scriptContext, void* data, unsigned int length)
{
    Js::JavascriptLibrary* library = scriptContext->GetLibrary();

    Js::ArrayBufferBase* arrayBuffer = RecyclerNew(
        scriptContext->GetRecycler(),
        Js::ExternalArrayBuffer,
        reinterpret_cast<BYTE*>(data),
        length * sizeof(T),
        library->GetArrayBufferType());

    return static_cast<Js::ArrayObject*>(Js::TypedArray<T, clamped>::Create(arrayBuffer, 0, length, library));
}